

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void __thiscall
testing::internal::DefaultPerThreadTestPartResultReporter::ReportTestPartResult
          (DefaultPerThreadTestPartResultReporter *this,TestPartResult *result)

{
  TestPartResultReporterInterface *pTVar1;
  TestPartResult *result_local;
  DefaultPerThreadTestPartResultReporter *this_local;
  
  pTVar1 = UnitTestImpl::GetGlobalTestPartResultReporter(this->unit_test_);
  (*pTVar1->_vptr_TestPartResultReporterInterface[2])(pTVar1,result);
  return;
}

Assistant:

void DefaultPerThreadTestPartResultReporter::ReportTestPartResult(
    const TestPartResult& result) {
  unit_test_->GetGlobalTestPartResultReporter()->ReportTestPartResult(result);
}